

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

void LinkedReadsDatastore::build_from_fastq
               (string *output_filename,string *default_name,string *read1_filename,
               string *read2_filename,LinkedReadsFormat format,uint64_t readsize,size_t chunksize)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  pointer pcVar4;
  _func_int *p_Var5;
  pointer pRVar6;
  size_type sVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  pointer pLVar10;
  LinkedTag (*paLVar11) [950956];
  pointer __position;
  pointer pvVar12;
  ulong uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  char cVar16;
  int i;
  int iVar17;
  uint uVar18;
  ostream *poVar19;
  long lVar20;
  size_t sVar21;
  long *plVar22;
  ulong uVar23;
  undefined1 auVar24 [8];
  pointer pbVar25;
  long *plVar26;
  int *piVar27;
  char *pcVar28;
  runtime_error *prVar29;
  long *plVar30;
  size_type *psVar31;
  pointer pbVar32;
  basic_ifstream<char,_std::char_traits<char>_> *c;
  ulong uVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 auVar36 [8];
  char cVar37;
  long lVar38;
  long lVar39;
  pointer pbVar40;
  undefined1 auVar41 [8];
  pointer *ppbVar42;
  LinkedReadData *r;
  ulong uVar43;
  LinkedReadData *r_1;
  uint uVar44;
  vector<ReadMapping,_std::allocator<ReadMapping>_> *v;
  bool bVar45;
  undefined8 uStack_7d0;
  undefined1 local_7c8 [8];
  char readbuffer [1000];
  long *local_3d8;
  ofstream output;
  long local_3c8 [2];
  byte abStack_3b8 [216];
  ios_base local_2e0 [264];
  undefined1 auStack_1d8 [8];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> next_in_chunk;
  undefined1 local_1b0 [8];
  LinkedReadData currrent_read;
  size_type local_158;
  LinkedTag (*__range2) [950956];
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_tag;
  undefined1 auStack_108 [8];
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  reads_in_node;
  undefined1 auStack_e8 [8];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> readdatav;
  uint64_t uStack_c8;
  SDG_FILETYPE type;
  uint64_t readsize_local;
  long local_b8;
  long local_b0;
  undefined1 auStack_a8 [8];
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  chunkfiles;
  string __str;
  uint64_t count_3;
  long local_60;
  long lStack_58;
  uint local_50;
  undefined4 uStack_4c;
  uint64_t count;
  undefined8 local_40;
  undefined8 uStack_38;
  
  __range2 = (LinkedTag (*) [950956])0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_c8 = readsize;
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Creating Datastore Index from ",0x1e);
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,(read1_filename->_M_dataplus)._M_p,read1_filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," | ",3);
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,(read2_filename->_M_dataplus)._M_p,read2_filename->_M_string_length);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  local_b8 = gzopen((read1_filename->_M_dataplus)._M_p,"r");
  if (local_b8 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(read1_filename->_M_dataplus)._M_p,
                         read1_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    piVar27 = __errno_location();
    pcVar28 = strerror(*piVar27);
    std::operator<<(poVar19,pcVar28);
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   "Could not open ",read1_filename);
    std::runtime_error::runtime_error(prVar29,(string *)local_7c8);
    __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b0 = gzopen((read2_filename->_M_dataplus)._M_p,"r");
  if (local_b0 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(read2_filename->_M_dataplus)._M_p,
                         read2_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    piVar27 = __errno_location();
    pcVar28 = strerror(*piVar27);
    std::operator<<(poVar19,pcVar28);
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   "Could not open ",read2_filename);
    std::runtime_error::runtime_error(prVar29,(string *)local_7c8);
    __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Building tag sorted chunks of ",0x1e);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs",6);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  auStack_e8 = (undefined1  [8])0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::reserve
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,chunksize);
  uVar9 = _setbuf;
  plVar26 = _VTT;
  auStack_a8 = (undefined1  [8])0x0;
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_1d8 = (undefined1  [8])0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currrent_read._0_8_ = &currrent_read.seq1._M_string_length;
  currrent_read.seq1._M_dataplus._M_p = (pointer)0x0;
  currrent_read.seq1._M_string_length._0_1_ = 0;
  currrent_read.seq1.field_2._8_8_ = &currrent_read.seq2._M_string_length;
  currrent_read.seq2._M_dataplus._M_p = (pointer)0x0;
  local_158 = 0;
  currrent_read.seq2._M_string_length._0_1_ = 0;
  lVar20 = 0x3f;
  if (chunksize != 0) {
    for (; chunksize >> lVar20 == 0; lVar20 = lVar20 + -1) {
    }
  }
  currrent_read.seq2.field_2._8_8_ = (ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e;
LAB_001896e0:
  while( true ) {
    iVar17 = gzeof();
    if ((iVar17 != 0) || (iVar17 = gzeof(), iVar17 != 0)) break;
    if (format == raw) goto LAB_00189786;
    if (format != UCDavis) goto LAB_00189bf6;
    lVar20 = gzgets(local_b8,local_7c8,999);
    if (lVar20 != 0) {
      lVar20 = 1;
      local_1b0._0_4_ = 0;
      do {
        local_1b0._0_4_ = local_1b0._0_4_ << 2;
        bVar2 = local_7c8[lVar20];
        if (bVar2 < 0x47) {
          if (bVar2 != 0x41) {
            if (bVar2 != 0x43) {
LAB_0018981a:
              local_1b0._0_4_ = 0;
              break;
            }
            local_1b0._0_4_ = local_1b0._0_4_ | 1;
          }
        }
        else if (bVar2 == 0x47) {
          local_1b0._0_4_ = local_1b0._0_4_ | 2;
        }
        else {
          if (bVar2 != 0x54) goto LAB_0018981a;
          local_1b0._0_4_ = local_1b0._0_4_ | 3;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x11);
      lVar20 = gzgets(local_b8,local_7c8,999);
      if (lVar20 != 0) {
        local_3d8 = local_3c8;
        sVar21 = strlen(local_7c8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3d8,local_7c8,local_7c8 + sVar21);
        std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3d8);
        if (local_3d8 != local_3c8) {
          operator_delete(local_3d8,local_3c8[0] + 1);
        }
        if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
          std::__cxx11::string::resize
                    ((ulong)&currrent_read,(char)currrent_read.seq1._M_dataplus._M_p + -1);
        }
        lVar20 = gzgets(local_b8,local_7c8,999);
        if (((lVar20 != 0) && (lVar20 = gzgets(local_b8,local_7c8,999), lVar20 != 0)) &&
           ((lVar20 = gzgets(local_b0,local_7c8,999), lVar20 != 0 &&
            (lVar20 = gzgets(local_b0,local_7c8,999), lVar20 != 0)))) {
          local_3d8 = local_3c8;
          sVar21 = strlen(local_7c8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3d8,local_7c8,local_7c8 + sVar21);
          std::__cxx11::string::operator=
                    ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),(string *)&local_3d8);
          if (local_3d8 != local_3c8) {
            operator_delete(local_3d8,local_3c8[0] + 1);
          }
          if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] == '\n') {
            std::__cxx11::string::resize
                      ((ulong)((long)&currrent_read.seq1.field_2 + 8),
                       (char)currrent_read.seq2._M_dataplus._M_p + -1);
          }
          lVar20 = gzgets(local_b0,local_7c8,999);
          if (lVar20 != 0) {
            lVar20 = gzgets(local_b0,local_7c8,999);
            goto LAB_00189be1;
          }
        }
      }
    }
  }
  pLVar10 = readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar36 = auStack_e8;
  if ((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
            super__Vector_impl_data._M_start - (long)auStack_e8 != 0) {
    uVar33 = ((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 3) *
             -0x71c71c71c71c71c7;
    lVar20 = 0x3f;
    if (uVar33 != 0) {
      for (; uVar33 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (auStack_e8,
               readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl
               .super__Vector_impl_data._M_start,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar36,pLVar10);
    uVar33 = ((long)chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
             0xfc0fc0fc0fc0fc1;
    cVar37 = '\x01';
    if (9 < uVar33) {
      uVar23 = uVar33;
      cVar16 = '\x04';
      do {
        cVar37 = cVar16;
        if (uVar23 < 100) {
          cVar37 = cVar37 + -2;
          goto LAB_0018a36d;
        }
        if (uVar23 < 1000) {
          cVar37 = cVar37 + -1;
          goto LAB_0018a36d;
        }
        if (uVar23 < 10000) goto LAB_0018a36d;
        bVar45 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar16 = cVar37 + '\x04';
      } while (bVar45);
      cVar37 = cVar37 + '\x01';
    }
LAB_0018a36d:
    chunkfiles.
    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
    std::__cxx11::string::_M_construct
              ((ulong)&chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar37);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (uint)__str._M_dataplus._M_p,uVar33);
    plVar22 = (long *)std::__cxx11::string::replace
                                ((ulong)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                 (char *)0x0,0x2230b0);
    plVar30 = plVar22 + 2;
    if ((long *)*plVar22 == plVar30) {
      local_60 = *plVar30;
      lStack_58 = plVar22[3];
      __str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar30;
      __str.field_2._8_8_ = (long *)*plVar22;
    }
    *plVar22 = (long)plVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    plVar22 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    _local_50 = (pointer)&stack0xffffffffffffffc0;
    psVar31 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar31) {
      local_40 = *psVar31;
      uStack_38 = plVar22[3];
    }
    else {
      local_40 = *psVar31;
      _local_50 = (pointer)*plVar22;
    }
    count = plVar22[1];
    *plVar22 = (long)psVar31;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    std::ofstream::ofstream(&local_3d8,(string *)&stack0xffffffffffffffb0,_S_out);
    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
      operator_delete(_local_50,local_40 + 1);
    }
    if ((long *)__str.field_2._8_8_ != &local_60) {
      operator_delete((void *)__str.field_2._8_8_,local_60 + 1);
    }
    if (chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
      operator_delete(chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,__str._M_string_length + 1)
      ;
    }
    poVar19 = sdglib::OutputLog(INFO,true);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs dumping on chunk ",0x18);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open ",0xf);
      std::__cxx11::to_string
                ((string *)
                 &chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 ((long)chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                 0xfc0fc0fc0fc0fc1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8),"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      plVar26 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      _local_50 = (pointer)*plVar26;
      psVar31 = (size_type *)(plVar26 + 2);
      if ((size_type *)_local_50 == psVar31) {
        local_40 = *psVar31;
        uStack_38 = plVar26[3];
        _local_50 = (pointer)&stack0xffffffffffffffc0;
      }
      else {
        local_40 = *psVar31;
      }
      count = plVar26[1];
      *plVar26 = (long)psVar31;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,_local_50,count);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
      piVar27 = __errno_location();
      pcVar28 = strerror(*piVar27);
      std::operator<<(poVar19,pcVar28);
      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(_local_50,local_40 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_60) {
        operator_delete((void *)__str.field_2._8_8_,local_60 + 1);
      }
      if (chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
        operator_delete(chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        __str._M_string_length + 1);
      }
      prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                ((string *)auStack_108,
                 ((long)chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                 0xfc0fc0fc0fc0fc1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_108);
      plVar26 = (long *)std::__cxx11::string::append
                                  ((char *)&chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __str.field_2._8_8_ = *plVar26;
      plVar22 = plVar26 + 2;
      if ((long *)__str.field_2._8_8_ == plVar22) {
        local_60 = *plVar22;
        lStack_58 = plVar26[3];
        __str.field_2._8_8_ = &local_60;
      }
      else {
        local_60 = *plVar22;
      }
      *plVar26 = (long)plVar22;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8));
      std::runtime_error::runtime_error(prVar29,(string *)&stack0xffffffffffffffb0);
      __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar19 = sdglib::OutputLog(INFO,true);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs dumping on chunk ",0x18);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    uVar33 = uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0;
    lVar20 = -uVar33;
    puVar34 = local_7c8 + lVar20;
    readsize_local =
         (uint64_t)
         readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (auStack_e8 !=
        (undefined1  [8])
        readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
        super__Vector_impl_data._M_start) {
      auVar36 = auStack_e8;
      do {
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a64c;
        std::ostream::write((char *)&local_3d8,(long)auVar36);
        uVar13 = uStack_c8;
        lVar39 = uStack_c8 * 2;
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a668;
        memset(puVar34,0,lVar39 + 2);
        pcVar4 = (((pointer)auVar36)->seq1)._M_dataplus._M_p;
        uVar23 = (((pointer)auVar36)->seq1)._M_string_length;
        if (uVar13 <= uVar23) {
          uVar23 = uVar13;
        }
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a67f;
        memcpy(puVar34,pcVar4,uVar23);
        pcVar4 = (((pointer)auVar36)->seq2)._M_dataplus._M_p;
        uVar23 = (((pointer)auVar36)->seq2)._M_string_length;
        uVar43 = uVar13;
        if (uVar23 < uVar13) {
          uVar43 = uVar23;
        }
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a6a1;
        memcpy(local_7c8 + (uVar13 - uVar33) + 1,pcVar4,uVar43);
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a6af;
        std::ostream::write((char *)&local_3d8,(long)puVar34);
        auVar36 = (undefined1  [8])((long)auVar36 + 0x48);
      } while (auVar36 != (undefined1  [8])readsize_local);
    }
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a6d0;
    std::ofstream::close();
    uVar33 = ((long)chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
             0xfc0fc0fc0fc0fc1;
    cVar37 = '\x01';
    if (9 < uVar33) {
      uVar23 = uVar33;
      cVar16 = '\x04';
      do {
        cVar37 = cVar16;
        if (uVar23 < 100) {
          cVar37 = cVar37 + -2;
          goto LAB_0018a74a;
        }
        if (uVar23 < 1000) {
          cVar37 = cVar37 + -1;
          goto LAB_0018a74a;
        }
        if (uVar23 < 10000) goto LAB_0018a74a;
        bVar45 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar16 = cVar37 + '\x04';
      } while (bVar45);
      cVar37 = cVar37 + '\x01';
    }
LAB_0018a74a:
    chunkfiles.
    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a761;
    std::__cxx11::string::_M_construct
              ((ulong)&chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar37);
    pbVar40 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a777;
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)pbVar40,(uint)__str._M_dataplus._M_p,uVar33);
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a790;
    plVar22 = (long *)std::__cxx11::string::replace
                                ((ulong)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                 (char *)0x0,0x2230b0);
    plVar30 = plVar22 + 2;
    if ((long *)*plVar22 == plVar30) {
      local_60 = *plVar30;
      lStack_58 = plVar22[3];
      __str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar30;
      __str.field_2._8_8_ = (long *)*plVar22;
    }
    *plVar22 = (long)plVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a7df;
    plVar22 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    _local_50 = (pointer)&stack0xffffffffffffffc0;
    psVar31 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar31) {
      local_40 = *psVar31;
      uStack_38 = plVar22[3];
    }
    else {
      local_40 = *psVar31;
      _local_50 = (pointer)*plVar22;
    }
    count = plVar22[1];
    *plVar22 = (long)psVar31;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a830;
    std::vector<std::ifstream,std::allocator<std::ifstream>>::emplace_back<std::__cxx11::string>
              ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
    _Var15._M_p = _local_50;
    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
      uVar33 = local_40 + 1;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a849;
      operator_delete(_Var15._M_p,uVar33);
    }
    uVar14 = __str.field_2._8_8_;
    if ((long *)__str.field_2._8_8_ != &local_60) {
      uVar33 = local_60 + 1;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a85e;
      operator_delete((void *)uVar14,uVar33);
    }
    pbVar40 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
      uVar33 = __str._M_string_length + 1;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a87a;
      operator_delete(pbVar40,uVar33);
    }
    auVar36 = auStack_e8;
    if (((byte)chunkfiles.
               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [*(long *)(*(long *)(chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + -0x208) + -0x18) +
                -0x1e8] & 5) != 0) {
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b7c9;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open ",0xf);
      lVar39 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b7f5;
      std::__cxx11::to_string
                ((string *)
                 &chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (lVar39 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b80c;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8),"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b81c;
      plVar26 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      _local_50 = (pointer)*plVar26;
      psVar31 = (size_type *)(plVar26 + 2);
      if ((size_type *)_local_50 == psVar31) {
        local_40 = *psVar31;
        uStack_38 = plVar26[3];
        _local_50 = (pointer)&stack0xffffffffffffffc0;
      }
      else {
        local_40 = *psVar31;
      }
      _Var15._M_p = _local_50;
      uVar8 = plVar26[1];
      *plVar26 = (long)psVar31;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      count = uVar8;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc42;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,_Var15._M_p,uVar8);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc59;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc5e;
      piVar27 = __errno_location();
      iVar17 = *piVar27;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc65;
      pcVar28 = strerror(iVar17);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc70;
      std::operator<<(poVar19,pcVar28);
      _Var15._M_p = _local_50;
      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
        uVar33 = local_40 + 1;
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bc89;
        operator_delete(_Var15._M_p,uVar33);
      }
      uVar9 = __str.field_2._8_8_;
      if ((long *)__str.field_2._8_8_ != &local_60) {
        uVar33 = local_60 + 1;
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bca2;
        operator_delete((void *)uVar9,uVar33);
      }
      pbVar40 = chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
        *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bcbe;
        operator_delete(pbVar40,__str._M_string_length + 1);
      }
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bcc8;
      prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
      lVar39 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bcf7;
      std::__cxx11::to_string((string *)auStack_108,(lVar39 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bd11;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_108);
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bd24;
      plVar26 = (long *)std::__cxx11::string::append
                                  ((char *)&chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __str.field_2._8_8_ = *plVar26;
      plVar22 = plVar26 + 2;
      if ((long *)__str.field_2._8_8_ == plVar22) {
        local_60 = *plVar22;
        lStack_58 = plVar26[3];
        __str.field_2._8_8_ = &local_60;
      }
      else {
        local_60 = *plVar22;
      }
      *plVar26 = (long)plVar22;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18beaa;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8));
      *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18beb9;
      std::runtime_error::runtime_error(prVar29,(string *)&stack0xffffffffffffffb0);
      *(undefined1 **)((long)&uStack_7d0 + lVar20) = &LAB_0018bed2;
      __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8a9;
    std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::_M_erase_at_end
              ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,
               (pointer)auVar36);
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8b5;
    poVar19 = sdglib::OutputLog(INFO,true);
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8cc;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"dumped!",7);
    p_Var5 = poVar19->_vptr_basic_ostream[-3];
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8e0;
    std::ios::widen((char)p_Var5 + (char)poVar19);
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8eb;
    std::ostream::put((char)poVar19);
    *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a8f3;
    std::ostream::flush();
    local_3d8 = plVar26;
    *(undefined8 *)((long)&local_3d8 + plVar26[-3]) = uVar9;
    std::filebuf::~filebuf((filebuf *)&output);
    std::ios_base::~ios_base(local_2e0);
  }
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"performing merge from disk",0x1a);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::ofstream::ofstream(&local_3d8,(output_filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(output_filename->_M_dataplus)._M_p,
                         output_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    piVar27 = __errno_location();
    pcVar28 = strerror(*piVar27);
    std::operator<<(poVar19,pcVar28);
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb0,"Could not open ",output_filename);
    std::runtime_error::runtime_error(prVar29,(string *)&stack0xffffffffffffffb0);
    __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::write((char *)&local_3d8,0x22302c);
  std::ostream::write((char *)&local_3d8,0x22302e);
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = 3;
  std::ostream::write((char *)&local_3d8,
                      (long)((long)&readdatav.
                                    super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  _local_50 = (pointer)default_name->_M_string_length;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  std::ostream::write((char *)&local_3d8,(long)(default_name->_M_dataplus)._M_p);
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffff38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,local_158);
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"leaving space for ",0x12);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," read_tag entries",0x11);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  _local_50 = (pointer)((long)read_tag.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)__range2 >> 2);
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  if (_local_50 != (pointer)0x0) {
    std::ostream::write((char *)&local_3d8,(long)__range2);
  }
  auVar36 = auStack_a8;
  currrent_read.seq2.field_2._8_8_ =
       chunkfiles.
       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar20 = (long)chunkfiles.
                 super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3;
  readsize_local = lVar20 * 0xfc0fc0fc0fc0fc1;
  puVar34 = local_7c8 + -(lVar20 * 0x3f03f03f03f03f04 + 0xfU & 0xfffffffffffffff0);
  lVar20 = (long)puVar34 - (uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0);
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_7c8;
  if ((undefined1  [8])
      chunkfiles.
      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
    lVar39 = 0;
    uVar33 = 0;
    puVar35 = puVar34;
    next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_7c8;
    do {
      pbVar40 = (pointer)((long)auStack_a8 + lVar39);
      *(undefined8 *)(lVar20 + -8) = 0x18abbd;
      std::istream::read((char *)pbVar40,(long)puVar35);
      uVar33 = uVar33 + 1;
      uVar23 = ((long)chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
               0xfc0fc0fc0fc0fc1;
      lVar39 = lVar39 + 0x208;
      puVar35 = puVar35 + 4;
    } while (uVar33 <= uVar23 && uVar23 - uVar33 != 0);
  }
  if ((LinkedTag (*) [950956])
      read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != __range2) {
    read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = *__range2;
  }
  if ((int)readsize_local != 0) {
    lVar39 = readsize_local << 2;
    auVar24 = auStack_a8;
    pbVar40 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar32 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar41 = auStack_a8;
    do {
      local_50 = 0xffffffff;
      if ((undefined1  [8])currrent_read.seq2.field_2._8_8_ != auVar36) {
        uVar44 = 0xffffffff;
        lVar38 = 0;
        do {
          uVar3 = *(uint *)(puVar34 + lVar38);
          if (uVar3 < uVar44) {
            local_50 = uVar3;
            uVar44 = uVar3;
          }
          lVar38 = lVar38 + 4;
        } while (lVar39 != lVar38);
      }
      bVar45 = (undefined1  [8])pbVar32 != auVar41;
      pbVar32 = (pointer)auVar41;
      if (bVar45) {
        uVar33 = 0;
        do {
          lVar38 = uVar33 * 0x208;
          pbVar32 = (pointer)((long)auVar24 + lVar38);
          pbVar25 = (pointer)((long)auVar24 + lVar38);
          auVar24 = auVar41;
          if ((((byte)pbVar25[*(long *)(*(long *)pbVar32 + -0x18) + 0x20] & 2) == 0) &&
             (pbVar40 = chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             *(uint *)(puVar34 + uVar33 * 4) == local_50)) {
            puVar1 = (uint *)(puVar34 + uVar33 * 4);
            do {
              while( true ) {
                *(undefined8 *)(lVar20 + -8) = 0x18accf;
                std::istream::read((char *)pbVar25,lVar20);
                *(undefined8 *)(lVar20 + -8) = 0x18ace9;
                std::ostream::write((char *)&local_3d8,lVar20);
                __position = read_tag.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start ==
                    read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish) {
                  *(undefined8 *)(lVar20 + -8) = 0x18ad1b;
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&__range2,
                             (iterator)__position,&stack0xffffffffffffffb0);
                }
                else {
                  *read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start = local_50;
                  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                }
                pbVar40 = (pointer)((long)auStack_a8 + lVar38);
                *(undefined8 *)(lVar20 + -8) = 0x18ad32;
                std::istream::read((char *)pbVar40,(long)puVar1);
                pbVar25 = (pointer)((long)auStack_a8 + lVar38);
                if (((byte)pbVar25[*(long *)(*(long *)((long)auStack_a8 + lVar38) + -0x18) + 0x20] &
                    2) == 0) break;
                *puVar1 = 0xffffffff;
                *(undefined8 *)(lVar20 + -8) = 0x18ad72;
                poVar19 = sdglib::OutputLog(INFO,true);
                *(undefined8 *)(lVar20 + -8) = 0x18ad89;
                std::__ostream_insert<char,std::char_traits<char>>(poVar19,"chunk ",6);
                *(undefined8 *)(lVar20 + -8) = 0x18ad93;
                poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)uVar33);
                *(undefined8 *)(lVar20 + -8) = 0x18adaa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar19," finished",9);
                p_Var5 = poVar19->_vptr_basic_ostream[-3];
                *(undefined8 *)(lVar20 + -8) = 0x18adbf;
                std::ios::widen((char)p_Var5 + (char)poVar19);
                *(undefined8 *)(lVar20 + -8) = 0x18adca;
                std::ostream::put((char)poVar19);
                *(undefined8 *)(lVar20 + -8) = 0x18add2;
                std::ostream::flush();
                readsize_local = (uint64_t)((int)readsize_local - 1);
                pbVar25 = (pointer)((long)auStack_a8 + lVar38);
                pbVar40 = chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                auVar24 = auStack_a8;
                if ((((byte)pbVar25[*(long *)(*(long *)((long)auStack_a8 + lVar38) + -0x18) + 0x20]
                     & 2) != 0) || (*puVar1 != local_50)) goto LAB_0018ae27;
              }
              pbVar40 = chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              auVar24 = auStack_a8;
            } while (*puVar1 == local_50);
          }
LAB_0018ae27:
          uVar33 = uVar33 + 1;
          uVar23 = ((long)pbVar40 - (long)auVar24 >> 3) * 0xfc0fc0fc0fc0fc1;
          pbVar32 = pbVar40;
          auVar41 = auVar24;
        } while (uVar33 <= uVar23 && uVar23 - uVar33 != 0);
      }
    } while ((int)readsize_local != 0);
  }
  *(undefined8 *)(lVar20 + -8) = 0x18ae82;
  std::ostream::write((char *)&local_3d8,0x22302c);
  *(undefined8 *)(lVar20 + -8) = 0x18ae9a;
  std::ostream::write((char *)&local_3d8,0x22302e);
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = 6;
  *(undefined8 *)(lVar20 + -8) = 0x18aeb7;
  std::ostream::write((char *)&local_3d8,
                      (long)((long)&readdatav.
                                    super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  _local_50 = (pointer)0x0;
  *(undefined8 *)(lVar20 + -8) = 0x18aed3;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  if (_local_50 != (pointer)0x0) {
    *(undefined8 *)(lVar20 + -8) = 0x18aeee;
    std::ostream::write((char *)&local_3d8,0);
  }
  reads_in_node.
  super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  reads_in_node.
  super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __str.field_2._8_8_ = 0;
  *(undefined8 *)(lVar20 + -8) = 0x18af19;
  std::ostream::write((char *)&local_3d8,(long)((long)&__str.field_2 + 8));
  pvVar12 = reads_in_node.
            super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((__str.field_2._8_8_ != 0) &&
     (auStack_108 !=
      (undefined1  [8])
      reads_in_node.
      super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    auVar36 = auStack_108;
    do {
      _local_50 = (pointer)((long)(((pointer)auVar36)->
                                  super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(((pointer)auVar36)->
                                  super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 5);
      *(undefined8 *)(lVar20 + -8) = 0x18af5d;
      std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
      if (_local_50 != (pointer)0x0) {
        pRVar6 = (((pointer)auVar36)->super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(lVar20 + -8) = 0x18af75;
        std::ostream::write((char *)&local_3d8,(long)pRVar6);
      }
      auVar36 = (undefined1  [8])((long)auVar36 + 0x18);
    } while (auVar36 != (undefined1  [8])pvVar12);
  }
  sVar7 = default_name->_M_string_length;
  *(undefined8 *)(lVar20 + -8) = 0x18af9b;
  std::ostream::seekp(&local_3d8,sVar7 + 0x16,0);
  *(undefined8 *)(lVar20 + -8) = 0x18afa7;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)(lVar20 + -8) = 0x18afbe;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"writing down ",0xd);
  *(undefined8 *)(lVar20 + -8) = 0x18afcd;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18afe4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," read_tag entries",0x11);
  p_Var5 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)(lVar20 + -8) = 0x18aff8;
  std::ios::widen((char)p_Var5 + (char)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b003;
  std::ostream::put((char)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b00b;
  std::ostream::flush();
  _local_50 = (pointer)((long)read_tag.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)__range2 >> 2);
  *(undefined8 *)(lVar20 + -8) = 0x18b035;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  paLVar11 = __range2;
  if (_local_50 != (char *)0x0) {
    *(undefined8 *)(lVar20 + -8) = 0x18b055;
    std::ostream::write((char *)&local_3d8,(long)paLVar11);
  }
  *(undefined8 *)(lVar20 + -8) = 0x18b061;
  std::ofstream::close();
  pbVar40 = chunkfiles.
            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar36 = auStack_a8;
  if (auStack_a8 !=
      (undefined1  [8])
      chunkfiles.
      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      *(undefined8 *)(lVar20 + -8) = 0x18b080;
      std::ifstream::close();
      auVar36 = (undefined1  [8])((long)auVar36 + 0x208);
    } while (auVar36 != (undefined1  [8])pbVar40);
    if ((undefined1  [8])
        chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
      uVar33 = 0;
      ppbVar42 = &chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        uVar44 = 1;
        if (9 < uVar33) {
          uVar3 = 4;
          uVar23 = uVar33;
          do {
            uVar44 = uVar3;
            uVar18 = (uint)uVar23;
            if (uVar18 < 100) {
              uVar44 = uVar44 - 2;
              goto LAB_0018b100;
            }
            if (uVar18 < 1000) {
              uVar44 = uVar44 - 1;
              goto LAB_0018b100;
            }
            if (uVar18 < 10000) goto LAB_0018b100;
            uVar23 = (uVar23 & 0xffffffff) / 10000;
            uVar3 = uVar44 + 4;
          } while (99999 < uVar18);
          uVar44 = uVar44 + 1;
        }
LAB_0018b100:
        chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
        *(undefined8 *)(lVar20 + -8) = 0x18b11b;
        std::__cxx11::string::_M_construct((ulong)ppbVar42,(char)uVar44);
        pbVar40 = chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(lVar20 + -8) = 0x18b12c;
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)pbVar40,uVar44,(uint)uVar33);
        *(undefined8 *)(lVar20 + -8) = 0x18b145;
        plVar22 = (long *)std::__cxx11::string::replace((ulong)ppbVar42,0,(char *)0x0,0x2230b0);
        __str.field_2._8_8_ = &local_60;
        plVar30 = plVar22 + 2;
        if ((long *)*plVar22 == plVar30) {
          local_60 = *plVar30;
          lStack_58 = plVar22[3];
        }
        else {
          local_60 = *plVar30;
          __str.field_2._8_8_ = (long *)*plVar22;
        }
        *plVar22 = (long)plVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        *(undefined8 *)(lVar20 + -8) = 0x18b195;
        plVar22 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        psVar31 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar31) {
          local_40 = *psVar31;
          uStack_38 = plVar22[3];
          _local_50 = (pointer)&stack0xffffffffffffffc0;
        }
        else {
          local_40 = *psVar31;
          _local_50 = (pointer)*plVar22;
        }
        _Var15._M_p = _local_50;
        count = plVar22[1];
        *plVar22 = (long)psVar31;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        *(undefined8 *)(lVar20 + -8) = 0x18b1e0;
        unlink(_Var15._M_p);
        _Var15._M_p = _local_50;
        if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
          uVar23 = local_40 + 1;
          *(undefined8 *)(lVar20 + -8) = 0x18b1f5;
          operator_delete(_Var15._M_p,uVar23);
        }
        uVar14 = __str.field_2._8_8_;
        if ((long *)__str.field_2._8_8_ != &local_60) {
          uVar23 = local_60 + 1;
          *(undefined8 *)(lVar20 + -8) = 0x18b20e;
          operator_delete((void *)uVar14,uVar23);
        }
        pbVar40 = chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (chunkfiles.
            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length)
        {
          uVar23 = __str._M_string_length + 1;
          *(undefined8 *)(lVar20 + -8) = 0x18b22a;
          operator_delete(pbVar40,uVar23);
        }
        uVar33 = uVar33 + 1;
        uVar23 = ((long)chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                 0xfc0fc0fc0fc0fc1;
      } while (uVar33 <= uVar23 && uVar23 - uVar33 != 0);
    }
  }
  *(undefined8 *)(lVar20 + -8) = 0x18b262;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)(lVar20 + -8) = 0x18b279;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Datastore with ",0xf);
  *(undefined8 *)(lVar20 + -8) = 0x18b292;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b2a9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," reads, ",8);
  *(undefined8 *)(lVar20 + -8) = 0x18b2b8;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b2cf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," reads with tags",0x10);
  p_Var5 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)(lVar20 + -8) = 0x18b2e3;
  std::ios::widen((char)p_Var5 + (char)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b2ee;
  std::ostream::put((char)poVar19);
  *(undefined8 *)(lVar20 + -8) = 0x18b2f6;
  std::ostream::flush();
  lVar39 = local_b8;
  *(undefined8 *)(lVar20 + -8) = 0x18b302;
  gzclose(lVar39);
  lVar39 = local_b0;
  *(undefined8 *)(lVar20 + -8) = 0x18b30e;
  gzclose(lVar39);
  *(undefined8 *)(lVar20 + -8) = 0x18b31a;
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::~vector((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
             *)auStack_108);
  pLVar10 = next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3d8 = plVar26;
  *(undefined8 *)((long)&local_3d8 + plVar26[-3]) = uVar9;
  *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b34b;
  std::filebuf::~filebuf((filebuf *)&output);
  *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b357;
  std::ios_base::~ios_base(local_2e0);
  uVar9 = currrent_read.seq1.field_2._8_8_;
  if ((size_type *)currrent_read.seq1.field_2._8_8_ != &currrent_read.seq2._M_string_length) {
    lVar20 = CONCAT71(currrent_read.seq2._M_string_length._1_7_,
                      (undefined1)currrent_read.seq2._M_string_length);
    *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b379;
    operator_delete((void *)uVar9,lVar20 + 1);
  }
  uVar9 = currrent_read._0_8_;
  if ((size_type *)currrent_read._0_8_ != &currrent_read.seq1._M_string_length) {
    lVar20 = CONCAT71(currrent_read.seq1._M_string_length._1_7_,
                      (undefined1)currrent_read.seq1._M_string_length);
    *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b39b;
    operator_delete((void *)uVar9,lVar20 + 1);
  }
  *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b3a7;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_1d8);
  *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b3b3;
  std::
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             *)auStack_a8);
  *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b3bf;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8);
  paLVar11 = __range2;
  if (__range2 != (LinkedTag (*) [950956])0x0) {
    uVar33 = (long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__range2;
    *(undefined8 *)((long)&pLVar10[-1].seq2.field_2 + 8) = 0x18b3da;
    operator_delete(paLVar11,uVar33);
  }
  return;
LAB_00189786:
  lVar20 = gzgets(local_b8,local_7c8,999);
  if ((lVar20 != 0) && (lVar20 = gzgets(local_b8,local_7c8,999), lVar20 != 0)) {
    lVar20 = 0;
    local_1b0._0_4_ = 0;
    do {
      local_1b0._0_4_ = local_1b0._0_4_ << 2;
      bVar2 = local_7c8[lVar20];
      if (bVar2 < 0x47) {
        if (bVar2 != 0x41) {
          if (bVar2 != 0x43) {
LAB_00189a10:
            local_1b0._0_4_ = 0;
            break;
          }
          local_1b0._0_4_ = local_1b0._0_4_ | 1;
        }
      }
      else if (bVar2 == 0x47) {
        local_1b0._0_4_ = local_1b0._0_4_ | 2;
      }
      else {
        if (bVar2 != 0x54) goto LAB_00189a10;
        local_1b0._0_4_ = local_1b0._0_4_ | 3;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    pcVar28 = readbuffer + 0xf;
    local_3d8 = local_3c8;
    sVar21 = strlen(pcVar28);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,pcVar28,pcVar28 + sVar21);
    std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3d8);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8,local_3c8[0] + 1);
    }
    if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
      std::__cxx11::string::resize
                ((ulong)&currrent_read,(char)currrent_read.seq1._M_dataplus._M_p + -1);
    }
    lVar20 = gzgets(local_b8,local_7c8,999);
    if ((((lVar20 != 0) && (lVar20 = gzgets(local_b8,local_7c8,999), lVar20 != 0)) &&
        (lVar20 = gzgets(local_b0,local_7c8,999), lVar20 != 0)) &&
       (lVar20 = gzgets(local_b0,local_7c8,999), lVar20 != 0)) {
      local_3d8 = local_3c8;
      sVar21 = strlen(local_7c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3d8,local_7c8,local_7c8 + sVar21);
      std::__cxx11::string::operator=
                ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),(string *)&local_3d8);
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8,local_3c8[0] + 1);
      }
      if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] == '\n') {
        std::__cxx11::string::resize
                  ((ulong)((long)&currrent_read.seq1.field_2 + 8),
                   (char)currrent_read.seq2._M_dataplus._M_p + -1);
      }
      lVar20 = gzgets(local_b0,local_7c8,999);
      if (lVar20 != 0) {
        lVar20 = gzgets(local_b0,local_7c8,999);
LAB_00189be1:
        if (lVar20 != 0) {
LAB_00189bf6:
          std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::push_back
                    ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,
                     (value_type *)local_1b0);
          pLVar10 = readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          auVar36 = auStack_e8;
          local_158 = local_158 + 1;
          if (((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 3) *
              -0x71c71c71c71c71c7 - chunksize == 0) {
            if (auStack_e8 !=
                (undefined1  [8])
                readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (auStack_e8,
                         readdatav.
                         super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl
                         .super__Vector_impl_data._M_start,currrent_read.seq2.field_2._8_8_);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (auVar36,pLVar10);
            }
            uVar33 = ((long)chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                     0xfc0fc0fc0fc0fc1;
            cVar37 = '\x01';
            ppbVar42 = &chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (9 < uVar33) {
              uVar23 = uVar33;
              cVar16 = '\x04';
              do {
                cVar37 = cVar16;
                if (uVar23 < 100) {
                  cVar37 = cVar37 + -2;
                  goto LAB_00189ce1;
                }
                if (uVar23 < 1000) {
                  cVar37 = cVar37 + -1;
                  goto LAB_00189ce1;
                }
                if (uVar23 < 10000) goto LAB_00189ce1;
                bVar45 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar16 = cVar37 + '\x04';
              } while (bVar45);
              cVar37 = cVar37 + '\x01';
            }
LAB_00189ce1:
            chunkfiles.
            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)ppbVar42,cVar37);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)chunkfiles.
                               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (uint)__str._M_dataplus._M_p,uVar33);
            plVar22 = (long *)std::__cxx11::string::replace((ulong)ppbVar42,0,(char *)0x0,0x2230b0);
            plVar30 = plVar22 + 2;
            if ((long *)*plVar22 == plVar30) {
              local_60 = *plVar30;
              lStack_58 = plVar22[3];
              __str.field_2._8_8_ = &local_60;
            }
            else {
              local_60 = *plVar30;
              __str.field_2._8_8_ = (long *)*plVar22;
            }
            *plVar22 = (long)plVar30;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            plVar22 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
            psVar31 = (size_type *)(plVar22 + 2);
            if ((size_type *)*plVar22 == psVar31) {
              local_40 = *psVar31;
              uStack_38 = plVar22[3];
              _local_50 = (pointer)&stack0xffffffffffffffc0;
            }
            else {
              local_40 = *psVar31;
              _local_50 = (pointer)*plVar22;
            }
            count = plVar22[1];
            *plVar22 = (long)psVar31;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            std::ofstream::ofstream(&local_3d8,(string *)&stack0xffffffffffffffb0,_S_out);
            if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
              operator_delete(_local_50,local_40 + 1);
            }
            if ((long *)__str.field_2._8_8_ != &local_60) {
              operator_delete((void *)__str.field_2._8_8_,local_60 + 1);
            }
            if (chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                (pointer)&__str._M_string_length) {
              operator_delete(chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              __str._M_string_length + 1);
            }
            poVar19 = sdglib::OutputLog(INFO,true);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19," pairs dumping on chunk ",0x18);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to open ",0xf);
              std::__cxx11::to_string
                        ((string *)
                         &chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         ((long)chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                         0xfc0fc0fc0fc0fc1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&__str.field_2 + 8),"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              plVar26 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
              _local_50 = (pointer)*plVar26;
              psVar31 = (size_type *)(plVar26 + 2);
              if ((size_type *)_local_50 == psVar31) {
                local_40 = *psVar31;
                uStack_38 = plVar26[3];
                _local_50 = (pointer)&stack0xffffffffffffffc0;
              }
              else {
                local_40 = *psVar31;
              }
              count = plVar26[1];
              *plVar26 = (long)psVar31;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,_local_50,count);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
              piVar27 = __errno_location();
              pcVar28 = strerror(*piVar27);
              std::operator<<(poVar19,pcVar28);
              if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                operator_delete(_local_50,local_40 + 1);
              }
              if ((long *)__str.field_2._8_8_ != &local_60) {
                operator_delete((void *)__str.field_2._8_8_,local_60 + 1);
              }
              if (chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                  (pointer)&__str._M_string_length) {
                operator_delete(chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                __str._M_string_length + 1);
              }
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string
                        ((string *)auStack_108,
                         ((long)chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                         0xfc0fc0fc0fc0fc1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_108);
              plVar26 = (long *)std::__cxx11::string::append
                                          ((char *)&chunkfiles.
                                                                                                        
                                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
              __str.field_2._8_8_ = *plVar26;
              plVar22 = plVar26 + 2;
              if ((long *)__str.field_2._8_8_ == plVar22) {
                local_60 = *plVar22;
                lStack_58 = plVar26[3];
                __str.field_2._8_8_ = &local_60;
              }
              else {
                local_60 = *plVar22;
              }
              *plVar26 = (long)plVar22;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xffffffffffffffb0,"Could not open ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&__str.field_2 + 8));
              std::runtime_error::runtime_error(prVar29,(string *)&stack0xffffffffffffffb0);
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            poVar19 = sdglib::OutputLog(INFO,true);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19," pairs dumping on chunk ",0x18);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            uVar33 = uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0;
            lVar20 = -uVar33;
            puVar34 = local_7c8 + lVar20;
            readsize_local =
                 (uint64_t)
                 readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            if (auStack_e8 !=
                (undefined1  [8])
                readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              auVar36 = auStack_e8;
              do {
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x189fae;
                std::ostream::write((char *)&local_3d8,(long)auVar36);
                uVar13 = uStack_c8;
                lVar39 = uStack_c8 * 2;
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x189fca;
                memset(puVar34,0,lVar39 + 2);
                pcVar4 = (((pointer)auVar36)->seq1)._M_dataplus._M_p;
                uVar23 = (((pointer)auVar36)->seq1)._M_string_length;
                if (uVar13 <= uVar23) {
                  uVar23 = uVar13;
                }
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x189fe1;
                memcpy(puVar34,pcVar4,uVar23);
                pcVar4 = (((pointer)auVar36)->seq2)._M_dataplus._M_p;
                uVar23 = (((pointer)auVar36)->seq2)._M_string_length;
                uVar43 = uVar13;
                if (uVar23 < uVar13) {
                  uVar43 = uVar23;
                }
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a003;
                memcpy(local_7c8 + (uVar13 - uVar33) + 1,pcVar4,uVar43);
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a011;
                std::ostream::write((char *)&local_3d8,(long)puVar34);
                auVar36 = (undefined1  [8])((long)auVar36 + 0x48);
              } while (auVar36 != (undefined1  [8])readsize_local);
            }
            ppbVar42 = &chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a031;
            std::ofstream::close();
            uVar33 = ((long)chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                     0xfc0fc0fc0fc0fc1;
            cVar37 = '\x01';
            if (9 < uVar33) {
              uVar23 = uVar33;
              cVar16 = '\x04';
              do {
                cVar37 = cVar16;
                if (uVar23 < 100) {
                  cVar37 = cVar37 + -2;
                  goto LAB_0018a0b5;
                }
                if (uVar23 < 1000) {
                  cVar37 = cVar37 + -1;
                  goto LAB_0018a0b5;
                }
                if (uVar23 < 10000) goto LAB_0018a0b5;
                bVar45 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar16 = cVar37 + '\x04';
              } while (bVar45);
              cVar37 = cVar37 + '\x01';
            }
LAB_0018a0b5:
            chunkfiles.
            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a0cc;
            std::__cxx11::string::_M_construct((ulong)ppbVar42,cVar37);
            uVar44 = (uint)__str._M_dataplus._M_p;
            pbVar40 = chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a0e2;
            std::__detail::__to_chars_10_impl<unsigned_long>((char *)pbVar40,uVar44,uVar33);
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a0fb;
            plVar22 = (long *)std::__cxx11::string::replace((ulong)ppbVar42,0,(char *)0x0,0x2230b0);
            plVar30 = plVar22 + 2;
            if ((long *)*plVar22 == plVar30) {
              local_60 = *plVar30;
              lStack_58 = plVar22[3];
              __str.field_2._8_8_ = &local_60;
            }
            else {
              local_60 = *plVar30;
              __str.field_2._8_8_ = (long *)*plVar22;
            }
            *plVar22 = (long)plVar30;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a14d;
            plVar22 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
            psVar31 = (size_type *)(plVar22 + 2);
            if ((size_type *)*plVar22 == psVar31) {
              local_40 = *psVar31;
              uStack_38 = plVar22[3];
              _local_50 = (pointer)&stack0xffffffffffffffc0;
            }
            else {
              local_40 = *psVar31;
              _local_50 = (pointer)*plVar22;
            }
            count = plVar22[1];
            *plVar22 = (long)psVar31;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a19b;
            std::vector<std::ifstream,std::allocator<std::ifstream>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffffb0);
            _Var15._M_p = _local_50;
            if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
              uVar33 = local_40 + 1;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a1b0;
              operator_delete(_Var15._M_p,uVar33);
            }
            uVar14 = __str.field_2._8_8_;
            if ((long *)__str.field_2._8_8_ != &local_60) {
              uVar33 = local_60 + 1;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a1cc;
              operator_delete((void *)uVar14,uVar33);
            }
            pbVar40 = chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                (pointer)&__str._M_string_length) {
              uVar33 = __str._M_string_length + 1;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a1e8;
              operator_delete(pbVar40,uVar33);
            }
            auVar36 = auStack_e8;
            if (((byte)chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(long *)(*(long *)(chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + -0x208) +
                                 -0x18) + -0x1e8] & 5) != 0) {
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b496;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to open ",0xf);
              lVar39 = (long)chunkfiles.
                             super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b4c2;
              std::__cxx11::to_string
                        ((string *)
                         &chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (lVar39 >> 3) * 0xfc0fc0fc0fc0fc1);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b4d9;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&__str.field_2 + 8),"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b4e9;
              plVar26 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
              _local_50 = (pointer)*plVar26;
              psVar31 = (size_type *)(plVar26 + 2);
              if ((size_type *)_local_50 == psVar31) {
                local_40 = *psVar31;
                uStack_38 = plVar26[3];
                _local_50 = (pointer)&stack0xffffffffffffffc0;
              }
              else {
                local_40 = *psVar31;
              }
              _Var15._M_p = _local_50;
              uVar8 = plVar26[1];
              *plVar26 = (long)psVar31;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              count = uVar8;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b9be;
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,_Var15._M_p,uVar8);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b9d5;
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b9da;
              piVar27 = __errno_location();
              iVar17 = *piVar27;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b9e1;
              pcVar28 = strerror(iVar17);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18b9ec;
              std::operator<<(poVar19,pcVar28);
              _Var15._M_p = _local_50;
              if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                uVar33 = local_40 + 1;
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba05;
                operator_delete(_Var15._M_p,uVar33);
              }
              uVar9 = __str.field_2._8_8_;
              if ((long *)__str.field_2._8_8_ != &local_60) {
                uVar33 = local_60 + 1;
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba1e;
                operator_delete((void *)uVar9,uVar33);
              }
              pbVar40 = chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                  (pointer)&__str._M_string_length) {
                *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba3a;
                operator_delete(pbVar40,__str._M_string_length + 1);
              }
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba44;
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              lVar39 = (long)chunkfiles.
                             super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba73;
              std::__cxx11::to_string((string *)auStack_108,(lVar39 >> 3) * 0xfc0fc0fc0fc0fc1);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18ba8d;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_108);
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18baa0;
              plVar26 = (long *)std::__cxx11::string::append
                                          ((char *)&chunkfiles.
                                                                                                        
                                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
              __str.field_2._8_8_ = *plVar26;
              plVar22 = plVar26 + 2;
              if ((long *)__str.field_2._8_8_ == plVar22) {
                local_60 = *plVar22;
                lStack_58 = plVar26[3];
                __str.field_2._8_8_ = &local_60;
              }
              else {
                local_60 = *plVar22;
              }
              *plVar26 = (long)plVar22;
              plVar26[1] = 0;
              *(undefined1 *)(plVar26 + 2) = 0;
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bde7;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xffffffffffffffb0,"Could not open ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&__str.field_2 + 8));
              *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18bdf6;
              std::runtime_error::runtime_error(prVar29,(string *)&stack0xffffffffffffffb0);
              *(undefined **)((long)&uStack_7d0 + lVar20) = &UNK_0018be0f;
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a21b;
            std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::_M_erase_at_end
                      ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,
                       (pointer)auVar36);
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a227;
            poVar19 = sdglib::OutputLog(INFO,true);
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a23e;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"dumped!",7);
            p_Var5 = poVar19->_vptr_basic_ostream[-3];
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a252;
            std::ios::widen((char)p_Var5 + (char)poVar19);
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a25d;
            std::ostream::put((char)poVar19);
            *(undefined8 *)((long)&uStack_7d0 + lVar20) = 0x18a265;
            std::ostream::flush();
            local_3d8 = plVar26;
            *(undefined8 *)((long)&local_3d8 + plVar26[-3]) = uVar9;
            std::filebuf::~filebuf((filebuf *)&output);
            std::ios_base::~ios_base(local_2e0);
          }
        }
      }
    }
  }
  goto LAB_001896e0;
}

Assistant:

void LinkedReadsDatastore::build_from_fastq(std::string output_filename, std::string default_name, std::string read1_filename,
                                            std::string read2_filename,
                                            LinkedReadsFormat format, uint64_t readsize, size_t chunksize) {
    std::vector<uint32_t> read_tag;
    //std::cout<<"Memory used by every read's entry:"<< sizeof(LinkedRead)<<std::endl;
    //read each read, put it on the index and on the appropriate tag
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Creating Datastore Index from "<<read1_filename<<" | "<<read2_filename<<std::endl;
    auto fd1=gzopen(read1_filename.c_str(),"r");
    if (!fd1) {
        std::cerr << "Failed to open " << read1_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read1_filename);
    }
    auto fd2=gzopen(read2_filename.c_str(),"r");

    if (!fd2) {
        std::cerr << "Failed to open " << read2_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read2_filename);
    }
    char readbuffer[1000];
    uint64_t r1offset,r2offset;
    uint64_t tagged_reads=0;
    //first, build an index of tags and offsets
    sdglib::OutputLog()<<"Building tag sorted chunks of "<<chunksize<<" pairs"<<std::endl;
    std::vector<LinkedReadData> readdatav;
    readdatav.reserve(chunksize);
    std::vector<std::ifstream> chunkfiles;
    std::vector<LinkedReadData> next_in_chunk;
    LinkedReadData currrent_read;
    //First, create the chunk files
    uint64_t pairs=0;
    while (!gzeof(fd1) and !gzeof(fd2)) {
        LinkedTag newtag = 0;
        if (format==LinkedReadsFormat::UCDavis) {
            //LinkedRead r1,r2;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            //Tag to number from r1's name
            for (auto i = 1; i < 17; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            currrent_read.seq1=std::string(readbuffer);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        else if (format==LinkedReadsFormat::raw){
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            for (auto i = 0; i < 16; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            currrent_read.seq1=std::string(readbuffer + 16 + 7);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        if (0 != newtag) tagged_reads += 2;
        ++pairs;
        readdatav.push_back(currrent_read);
        if (readdatav.size()==chunksize){
            //sort
            std::sort(readdatav.begin(),readdatav.end());
            //dump
            std::ofstream ofile("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            if (!ofile) {
                std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

            }

            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            //add file to vector of files
            char buffer[2*readsize+2];
            for (auto &r:readdatav){
                ofile.write((const char * ) &r.tag,sizeof(r.tag));
                bzero(buffer,2*readsize+2);
                memcpy(buffer,r.seq1.data(),(r.seq1.size()>readsize ? readsize : r.seq1.size()));
                memcpy(buffer+readsize+1,r.seq2.data(),(r.seq2.size()>readsize ? readsize : r.seq2.size()));
                ofile.write(buffer,2*readsize+2);
            }
            ofile.close();
            chunkfiles.emplace_back("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            if (!chunkfiles.back()) {
                std::cerr << "Failed to open " << ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") );
            }
            readdatav.clear();
            sdglib::OutputLog()<<"dumped!"<<std::endl;
        }
    }
    if (readdatav.size()>0) {
        //sort
        std::sort(readdatav.begin(), readdatav.end());
        //dump
        std::ofstream ofile("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        if (!ofile) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

        }
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        //add file to vector of files
        char buffer[2 * readsize + 2];
        for (auto &r:readdatav) {
            ofile.write((const char *) &r.tag, sizeof(r.tag));
            bzero(buffer, 2 * readsize + 2);
            memcpy(buffer, r.seq1.data(), (r.seq1.size() > readsize ? readsize : r.seq1.size()));
            memcpy(buffer + readsize + 1, r.seq2.data(), (r.seq2.size() > readsize ? readsize : r.seq2.size()));
            ofile.write(buffer, 2 * readsize + 2);
        }
        ofile.close();
        chunkfiles.emplace_back("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        if (!chunkfiles.back()) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data"));
        }
        readdatav.clear();
        sdglib::OutputLog() << "dumped!" << std::endl;
    }
    sdglib::OutputLog() << "performing merge from disk" << std::endl;
    //TODO: save space first for the tag index!!!
    std::ofstream output(output_filename.c_str());
    if (!output) {
        std::cerr << "Failed to open " << output_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_filename);
    }

    output.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((const char *) &SDG_VN, sizeof(SDG_VN));
    SDG_FILETYPE type(LinkedDS_FT);
    output.write((char *) &type, sizeof(type));

    sdglib::write_string(output, default_name);

    output.write((const char *) &readsize,sizeof(readsize));
    read_tag.resize(pairs);
    sdglib::OutputLog() << "leaving space for " <<pairs<<" read_tag entries"<< std::endl;

    sdglib::write_flat_vector(output,read_tag);

    //multi_way merge of the chunks
    int openfiles=chunkfiles.size();
    LinkedTag next_tags[chunkfiles.size()];
    char buffer[2 * readsize + 2];
    //read a bit from each file
    for (auto i=0;i<chunkfiles.size();++i) chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
    read_tag.clear();
    while(openfiles){
        LinkedTag mintag=UINT32_MAX;
        //find the minimum tag
        for (auto &t:next_tags) if (t<mintag) mintag=t;
        //copy from each file till the next tag is > than minimum
        for (auto i=0;i<chunkfiles.size();++i){
            while (!chunkfiles[i].eof() and next_tags[i]==mintag){
                //read buffer from file and write to final file
                chunkfiles[i].read(buffer,2*readsize+2);
                output.write(buffer,2*readsize+2);
                read_tag.push_back(mintag);
                //read next tag... eof? tag=UINT32_MAX
                chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
                if (chunkfiles[i].eof()) {
                    --openfiles;
                    next_tags[i]=UINT32_MAX;
                    sdglib::OutputLog() << "chunk "<<i<<" finished"<<std::endl;
                }
            }
        }
    }

    // Write empty mapper data
    output.write((char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((char *) &SDG_VN, sizeof(SDG_VN));
    type = PairedMap_FT;
    output.write((char *) &type, sizeof(type));

    std::vector<sgNodeID_t> read_to_node;
    sdglib::write_flat_vector(output, read_to_node);
    std::vector<std::vector<ReadMapping>> reads_in_node;
    sdglib::write_flat_vectorvector(output, reads_in_node);

    // Done

    //go back to the beginning of the file and write the read_tag part again
    output.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type)+sizeof(readsize)+sizeof(uint64_t)+(default_name.size()*sizeof(char)));
    sdglib::OutputLog() << "writing down " <<pairs<<" read_tag entries"<< std::endl;
    sdglib::write_flat_vector(output, read_tag);

    output.close();
    //delete all temporary chunk files
    for (auto &c:chunkfiles) c.close();
    for (auto i=0;i<chunkfiles.size();++i) ::unlink(("sorted_chunk_"+std::to_string(i)+".data").c_str());
    //DONE!
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Datastore with "<<(read_tag.size())*2<<" reads, "<<tagged_reads<<" reads with tags"<<std::endl; //and "<<reads_in_tag.size()<<"tags"<<std::endl;
    gzclose(fd1);
    gzclose(fd2);
}